

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Rotl_i64(w3Interp *this)

{
  byte bVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  
  uVar2 = w3Stack::pop_u64(&this->super_w3Stack);
  puVar3 = w3Stack::u64(&this->super_w3Stack);
  bVar1 = (byte)uVar2 & 0x3f;
  *puVar3 = *puVar3 << bVar1 | *puVar3 >> 0x40 - bVar1;
  return;
}

Assistant:

INTERP (Rotl_i64)
{
    const uint32_t n = 64;
    const uint32_t b = (uint32_t)(pop_u64 () & (n - 1));
    uint64_t& r = u64 ();
    uint64_t a = r;
#if _MSC_VER > 1100 // TODO which version
    r = _rotl64 (a, (int)b);
#else
    r = (a << b) | (a >> (n - b));
#endif
}